

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::postscriptStmt
          (Parser *this,
          unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *baseStmt)

{
  int iVar1;
  Stmt *pSVar2;
  Stmt *this_00;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  Opcode OVar6;
  LiteralType args;
  void **in_RDX;
  undefined1 local_90 [16];
  Opcode opc;
  undefined6 uStack_7e;
  string local_78;
  SourceLocation sloc;
  
  pSVar2 = baseStmt[6]._M_t.
           super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
  iVar1 = *(int *)((long)&pSVar2[2].super_ASTNode.location_ + 0x18);
  if ((iVar1 != 0x3a) && (iVar1 != 0x3d)) {
    *(void **)&(this->features_)._M_t._M_impl = *in_RDX;
    *in_RDX = (void *)0x0;
    return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
           (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
           this;
  }
  SourceLocation::SourceLocation
            (&sloc,(SourceLocation *)((long)&pSVar2[1].super_ASTNode.location_ + 0x20));
  nextToken((Parser *)baseStmt);
  logicExpr((Parser *)local_90);
  if ((_Base_ptr)local_90._0_8_ == (_Base_ptr)0x0) {
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
    goto LAB_0012953b;
  }
  if (iVar1 == 0x3d) {
    OVar6 = makeOperator(Not,(Expr *)local_90._0_8_);
    opc = OVar6;
    if (OVar6 != EXIT) {
      std::
      make_unique<flow::lang::UnaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                ((Opcode *)&local_78,
                 (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&opc,
                 (SourceLocation *)local_90);
      _Var4._M_p = local_78._M_dataplus._M_p;
      uVar3 = local_90._0_8_;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_90._0_8_ = _Var4._M_p;
      if (((_Base_ptr)uVar3 != (_Base_ptr)0x0) &&
         ((**(code **)(*(long *)uVar3 + 8))(),
         (_Base_ptr)local_78._M_dataplus._M_p != (_Base_ptr)0x0)) {
        (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
      }
      goto LAB_001294db;
    }
    pSVar2 = baseStmt[6]._M_t.
             super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
             super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    this_00 = baseStmt[0xd]._M_t.
              super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
              super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
              super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "Type cast error. No cast implementation found for requested cast from {} to {}.",
               (allocator<char> *)(local_90 + 0xf));
    args = (**(code **)(*(long *)local_90._0_8_ + 0x18))();
    diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
              ((Report *)this_00,(SourceLocation *)((long)&(pSVar2->super_ASTNode).location_ + 0x28)
               ,&local_78,args,Boolean);
    std::__cxx11::string::~string((string *)&local_78);
LAB_00129527:
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
LAB_001294db:
    bVar5 = consume((Parser *)baseStmt,Semicolon);
    if (!bVar5) goto LAB_00129527;
    _opc = (_Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)0x0;
    pSVar2 = baseStmt[6]._M_t.
             super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
             super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    sloc.end.offset = *(uint *)((long)&pSVar2[1].super_ASTNode.location_ + 0x1c);
    sloc.end._0_8_ = *(undefined8 *)((long)&pSVar2[1].super_ASTNode.location_ + 0x14);
    std::
    make_unique<flow::lang::CondStmt,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>,decltype(nullptr),flow::SourceLocation&>
              ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_78,
               (unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_90,
               in_RDX,(SourceLocation *)&opc);
    *(pointer *)&(this->features_)._M_t._M_impl = local_78._M_dataplus._M_p;
  }
  if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)0x0) {
    (**(code **)(*(long *)local_90._0_8_ + 8))();
  }
LAB_0012953b:
  std::__cxx11::string::~string((string *)&sloc);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::postscriptStmt(
    std::unique_ptr<Stmt> baseStmt) {
  Token op = token();
  switch (op) {
    case Token::If:
    case Token::Unless:
      break;
    default:
      return baseStmt;
  }

  // STMT ['if' EXPR] ';'
  // STMT ['unless' EXPR] ';'

  SourceLocation sloc = location();

  nextToken();  // 'if' | 'unless'

  std::unique_ptr<Expr> condExpr = expr();
  if (!condExpr) return nullptr;

  if (op == Token::Unless) {
    auto opc = makeOperator(Token::Not, condExpr.get());
    if (opc == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Type cast error. No cast implementation found for requested cast "
          "from {} to {}.",
          condExpr->getType(), LiteralType::Boolean);
      return nullptr;
    }

    condExpr = std::make_unique<UnaryExpr>(opc, std::move(condExpr), sloc);
  }

  if (!consume(Token::Semicolon)) return nullptr;

  return std::make_unique<CondStmt>(std::move(condExpr), std::move(baseStmt),
                                    nullptr, sloc.update(end()));
}